

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ed25519_asn1.cc
# Opt level: O2

int ed25519_set_pub_raw(EVP_PKEY *pkey,uint8_t *in,size_t len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  void *pvVar4;
  int iVar5;
  
  if (len == 0x20) {
    pvVar4 = OPENSSL_malloc(0x41);
    if (pvVar4 == (void *)0x0) {
      iVar5 = 0;
    }
    else {
      uVar1 = *(undefined8 *)in;
      uVar2 = *(undefined8 *)(in + 8);
      uVar3 = *(undefined8 *)(in + 0x18);
      *(undefined8 *)((long)pvVar4 + 0x30) = *(undefined8 *)(in + 0x10);
      *(undefined8 *)((long)pvVar4 + 0x38) = uVar3;
      *(undefined8 *)((long)pvVar4 + 0x20) = uVar1;
      *(undefined8 *)((long)pvVar4 + 0x28) = uVar2;
      *(undefined1 *)((long)pvVar4 + 0x40) = 0;
      ed25519_free(pkey);
      pkey->pkey = pvVar4;
      iVar5 = 1;
    }
  }
  else {
    iVar5 = 0;
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ed25519_asn1.cc"
                  ,0x38);
  }
  return iVar5;
}

Assistant:

static int ed25519_set_pub_raw(EVP_PKEY *pkey, const uint8_t *in, size_t len) {
  if (len != 32) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  ED25519_KEY *key =
      reinterpret_cast<ED25519_KEY *>(OPENSSL_malloc(sizeof(ED25519_KEY)));
  if (key == NULL) {
    return 0;
  }

  OPENSSL_memcpy(key->key + ED25519_PUBLIC_KEY_OFFSET, in, 32);
  key->has_private = 0;

  ed25519_free(pkey);
  pkey->pkey = key;
  return 1;
}